

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O0

bool __thiscall
xercesc_4_0::TraverseSchema::validateRedefineNameChange
          (TraverseSchema *this,DOMElement *redefineChildElem,XMLCh *redefineChildComponentName,
          XMLCh *redefineChildTypeName,int redefineNameCounter,SchemaInfo *redefiningSchemaInfo)

{
  XMLStringPool *pXVar1;
  RefHash2KeysTableOf<char16_t,_xercesc_4_0::StringHasher> *pRVar2;
  bool bVar3;
  int iVar4;
  uint key2;
  int iVar5;
  int iVar6;
  XMLCh *pXVar7;
  undefined4 extraout_var;
  DatatypeValidator *pDVar8;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  XMLCh *pXVar9;
  XMLCh *pXVar10;
  int attGroupRefCount;
  int groupRefCount;
  XMLCh *uriStr_1;
  XMLCh *localPart_1;
  XMLCh *prefix_1;
  XMLCh *greatGrandKidName;
  DOMElement *greatGrandKid;
  DOMElement *grandKid_1;
  XMLCh *uriStr;
  XMLCh *localPart;
  XMLCh *prefix;
  DOMElement *grandKid;
  XMLCh *typeNameStr;
  int fullTypeNameId;
  uint typeNameId;
  XMLCh *baseTypeName;
  SchemaInfo *redefiningSchemaInfo_local;
  int redefineNameCounter_local;
  XMLCh *redefineChildTypeName_local;
  XMLCh *redefineChildComponentName_local;
  DOMElement *redefineChildElem_local;
  TraverseSchema *this_local;
  
  iVar4 = (*(this->fStringPool->super_XSerializable)._vptr_XSerializable[5])
                    (this->fStringPool,redefineChildTypeName);
  XMLBuffer::set(&this->fBuffer,this->fTargetNSURIString);
  XMLBuffer::append(&this->fBuffer,L',');
  XMLBuffer::append(&this->fBuffer,redefineChildTypeName);
  pXVar1 = this->fStringPool;
  pXVar7 = XMLBuffer::getRawBuffer(&this->fBuffer);
  key2 = (*(pXVar1->super_XSerializable)._vptr_XSerializable[5])(pXVar1,pXVar7);
  iVar5 = (*(this->fStringPool->super_XSerializable)._vptr_XSerializable[10])
                    (this->fStringPool,(ulong)key2);
  pXVar7 = (XMLCh *)CONCAT44(extraout_var,iVar5);
  restoreSchemaInfo(this,redefiningSchemaInfo,INCLUDE,0xfffffffe);
  bVar3 = XMLString::equals(redefineChildComponentName,(XMLCh *)SchemaSymbols::fgELT_SIMPLETYPE);
  if (bVar3) {
    pDVar8 = DatatypeValidatorFactory::getDatatypeValidator(this->fDatatypeRegistry,pXVar7);
    if (pDVar8 != (DatatypeValidator *)0x0) {
      return false;
    }
    prefix = (XMLCh *)XUtil::getFirstChildElement(&redefineChildElem->super_DOMNode);
    if ((DOMNode *)prefix != (DOMNode *)0x0) {
      iVar5 = (*((DOMNode *)prefix)->_vptr_DOMNode[0x18])();
      bVar3 = XMLString::equals((XMLCh *)CONCAT44(extraout_var_00,iVar5),
                                (XMLCh *)SchemaSymbols::fgELT_ANNOTATION);
      if (bVar3) {
        prefix = (XMLCh *)XUtil::getNextSiblingElement((DOMNode *)prefix);
      }
    }
    if (prefix == (XMLCh *)0x0) {
      reportSchemaError(this,redefineChildElem,(XMLCh *)XMLUni::fgXMLErrDomain,0x78);
      return false;
    }
    pXVar7 = (XMLCh *)(**(code **)(*(long *)prefix + 0xc0))();
    bVar3 = XMLString::equals(pXVar7,(XMLCh *)SchemaSymbols::fgELT_RESTRICTION);
    if (!bVar3) {
      reportSchemaError(this,(DOMElement *)prefix,(XMLCh *)XMLUni::fgXMLErrDomain,0x78);
      return false;
    }
    pXVar7 = getElementAttValue(this,(DOMElement *)prefix,(XMLCh *)SchemaSymbols::fgATT_BASE,QName);
    pXVar9 = getPrefix(this,pXVar7);
    pXVar10 = getLocalPart(this,pXVar7);
    pXVar9 = resolvePrefixToURI(this,(DOMElement *)prefix,pXVar9);
    iVar5 = this->fTargetNSURI;
    iVar6 = (*(this->fURIStringPool->super_XSerializable)._vptr_XSerializable[5])
                      (this->fURIStringPool,pXVar9);
    if ((iVar5 != iVar6) ||
       (iVar5 = (*(this->fStringPool->super_XSerializable)._vptr_XSerializable[5])
                          (this->fStringPool,pXVar10), iVar5 != iVar4)) {
      reportSchemaError(this,(DOMElement *)prefix,(XMLCh *)XMLUni::fgXMLErrDomain,0x79);
      return false;
    }
    getRedefineNewTypeName(this,pXVar7,redefineNameCounter,&this->fBuffer);
    pXVar7 = XMLBuffer::getRawBuffer(&this->fBuffer);
    (**(code **)(*(long *)prefix + 0x160))(prefix,SchemaSymbols::fgATT_BASE,pXVar7);
    RefHash2KeysTableOf<char16_t,_xercesc_4_0::StringHasher>::put
              (this->fRedefineComponents,SchemaSymbols::fgELT_SIMPLETYPE,key2,(char16_t *)0x0);
  }
  else {
    bVar3 = XMLString::equals(redefineChildComponentName,(XMLCh *)SchemaSymbols::fgELT_COMPLEXTYPE);
    if (bVar3) {
      bVar3 = RefHashTableOf<xercesc_4_0::ComplexTypeInfo,_xercesc_4_0::StringHasher>::containsKey
                        (this->fComplexTypeRegistry,pXVar7);
      if (bVar3) {
        return false;
      }
      greatGrandKid = XUtil::getFirstChildElement(&redefineChildElem->super_DOMNode);
      if (&greatGrandKid->super_DOMNode != (DOMNode *)0x0) {
        iVar5 = (*(greatGrandKid->super_DOMNode)._vptr_DOMNode[0x18])();
        bVar3 = XMLString::equals((XMLCh *)CONCAT44(extraout_var_01,iVar5),
                                  (XMLCh *)SchemaSymbols::fgELT_ANNOTATION);
        if (bVar3) {
          greatGrandKid = XUtil::getNextSiblingElement(&greatGrandKid->super_DOMNode);
        }
      }
      if (greatGrandKid == (DOMElement *)0x0) {
        reportSchemaError(this,redefineChildElem,(XMLCh *)XMLUni::fgXMLErrDomain,0x7a);
        return false;
      }
      greatGrandKidName = (XMLCh *)XUtil::getFirstChildElement(&greatGrandKid->super_DOMNode);
      if ((DOMNode *)greatGrandKidName != (DOMNode *)0x0) {
        iVar5 = (*((DOMNode *)greatGrandKidName)->_vptr_DOMNode[0x18])();
        bVar3 = XMLString::equals((XMLCh *)CONCAT44(extraout_var_02,iVar5),
                                  (XMLCh *)SchemaSymbols::fgELT_ANNOTATION);
        if (bVar3) {
          greatGrandKidName = (XMLCh *)XUtil::getNextSiblingElement((DOMNode *)greatGrandKidName);
        }
      }
      if (greatGrandKidName == (XMLCh *)0x0) {
        reportSchemaError(this,greatGrandKid,(XMLCh *)XMLUni::fgXMLErrDomain,0x7a);
        return false;
      }
      pXVar7 = (XMLCh *)(**(code **)(*(long *)greatGrandKidName + 0xc0))();
      bVar3 = XMLString::equals(pXVar7,(XMLCh *)SchemaSymbols::fgELT_RESTRICTION);
      if ((!bVar3) &&
         (bVar3 = XMLString::equals(pXVar7,(XMLCh *)SchemaSymbols::fgELT_EXTENSION), !bVar3)) {
        reportSchemaError(this,(DOMElement *)greatGrandKidName,(XMLCh *)XMLUni::fgXMLErrDomain,0x7a)
        ;
        return false;
      }
      pXVar7 = getElementAttValue(this,(DOMElement *)greatGrandKidName,
                                  (XMLCh *)SchemaSymbols::fgATT_BASE,QName);
      pXVar9 = getPrefix(this,pXVar7);
      pXVar10 = getLocalPart(this,pXVar7);
      pXVar9 = resolvePrefixToURI(this,(DOMElement *)greatGrandKidName,pXVar9);
      iVar5 = this->fTargetNSURI;
      iVar6 = (*(this->fURIStringPool->super_XSerializable)._vptr_XSerializable[5])
                        (this->fURIStringPool,pXVar9);
      if ((iVar5 != iVar6) ||
         (iVar5 = (*(this->fStringPool->super_XSerializable)._vptr_XSerializable[5])
                            (this->fStringPool,pXVar10), iVar5 != iVar4)) {
        reportSchemaError(this,(DOMElement *)greatGrandKidName,(XMLCh *)XMLUni::fgXMLErrDomain,0x7b)
        ;
        return false;
      }
      getRedefineNewTypeName(this,pXVar7,redefineNameCounter,&this->fBuffer);
      pXVar7 = XMLBuffer::getRawBuffer(&this->fBuffer);
      (**(code **)(*(long *)greatGrandKidName + 0x160))
                (greatGrandKidName,SchemaSymbols::fgATT_BASE,pXVar7);
      RefHash2KeysTableOf<char16_t,_xercesc_4_0::StringHasher>::put
                (this->fRedefineComponents,SchemaSymbols::fgELT_COMPLEXTYPE,key2,(char16_t *)0x0);
    }
    else {
      bVar3 = XMLString::equals(redefineChildComponentName,(XMLCh *)SchemaSymbols::fgELT_GROUP);
      if (bVar3) {
        bVar3 = RefHashTableOf<xercesc_4_0::XercesGroupInfo,_xercesc_4_0::StringHasher>::containsKey
                          (this->fGroupRegistry,pXVar7);
        if (bVar3) {
          return false;
        }
        iVar4 = changeRedefineGroup(this,redefineChildElem,redefineChildComponentName,
                                    redefineChildTypeName,redefineNameCounter);
        if (1 < iVar4) {
          reportSchemaError(this,redefineChildElem,(XMLCh *)XMLUni::fgXMLErrDomain,0x7e);
          return false;
        }
        if (iVar4 == 0) {
          pRVar2 = this->fRedefineComponents;
          pXVar7 = SchemaInfo::getCurrentSchemaURL(this->fSchemaInfo);
          RefHash2KeysTableOf<char16_t,_xercesc_4_0::StringHasher>::put
                    (pRVar2,SchemaSymbols::fgELT_GROUP,key2,pXVar7);
        }
        else {
          RefHash2KeysTableOf<char16_t,_xercesc_4_0::StringHasher>::put
                    (this->fRedefineComponents,SchemaSymbols::fgELT_GROUP,key2,(char16_t *)0x0);
        }
      }
      else {
        bVar3 = XMLString::equals(redefineChildComponentName,
                                  (XMLCh *)SchemaSymbols::fgELT_ATTRIBUTEGROUP);
        if (!bVar3) {
          reportSchemaError(this,redefineChildElem,(XMLCh *)XMLUni::fgXMLErrDomain,0x80,
                            redefineChildComponentName,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
          return false;
        }
        bVar3 = RefHashTableOf<xercesc_4_0::XercesAttGroupInfo,_xercesc_4_0::StringHasher>::
                containsKey(this->fAttGroupRegistry,redefineChildTypeName);
        if (bVar3) {
          return false;
        }
        iVar4 = changeRedefineGroup(this,redefineChildElem,redefineChildComponentName,
                                    redefineChildTypeName,redefineNameCounter);
        if (1 < iVar4) {
          reportSchemaError(this,redefineChildElem,(XMLCh *)XMLUni::fgXMLErrDomain,0x7f);
          return false;
        }
        if (iVar4 == 0) {
          pRVar2 = this->fRedefineComponents;
          pXVar7 = SchemaInfo::getCurrentSchemaURL(this->fSchemaInfo);
          RefHash2KeysTableOf<char16_t,_xercesc_4_0::StringHasher>::put
                    (pRVar2,SchemaSymbols::fgELT_ATTRIBUTEGROUP,key2,pXVar7);
        }
        else {
          RefHash2KeysTableOf<char16_t,_xercesc_4_0::StringHasher>::put
                    (this->fRedefineComponents,SchemaSymbols::fgELT_ATTRIBUTEGROUP,key2,
                     (char16_t *)0x0);
        }
      }
    }
  }
  return true;
}

Assistant:

bool TraverseSchema::validateRedefineNameChange(const DOMElement* const redefineChildElem,
                                                const XMLCh* const redefineChildComponentName,
                                                const XMLCh* const redefineChildTypeName,
                                                const int redefineNameCounter,
                                                SchemaInfo* const redefiningSchemaInfo) {

    const XMLCh* baseTypeName = 0;
    unsigned int typeNameId = fStringPool->addOrFind(redefineChildTypeName);

    fBuffer.set(fTargetNSURIString);
    fBuffer.append(chComma);
    fBuffer.append(redefineChildTypeName);

    int   fullTypeNameId = fStringPool->addOrFind(fBuffer.getRawBuffer());
    const XMLCh* typeNameStr = fStringPool->getValueForId(fullTypeNameId);

    restoreSchemaInfo(redefiningSchemaInfo);

    if (XMLString::equals(redefineChildComponentName,SchemaSymbols::fgELT_SIMPLETYPE)) {

        if (fDatatypeRegistry->getDatatypeValidator(typeNameStr)) {
            return false;
        }

        DOMElement* grandKid = XUtil::getFirstChildElement(redefineChildElem);

        if (grandKid && XMLString::equals(grandKid->getLocalName(), SchemaSymbols::fgELT_ANNOTATION)) {
            grandKid = XUtil::getNextSiblingElement(grandKid);
        }

        if (grandKid == 0) {

            reportSchemaError(redefineChildElem, XMLUni::fgXMLErrDomain, XMLErrs::Redefine_InvalidSimpleType);
            return false;
        }
        else if(!XMLString::equals(grandKid->getLocalName(), SchemaSymbols::fgELT_RESTRICTION)) {

            reportSchemaError(grandKid, XMLUni::fgXMLErrDomain, XMLErrs::Redefine_InvalidSimpleType);
            return false;
        }

        baseTypeName = getElementAttValue(grandKid, SchemaSymbols::fgATT_BASE, DatatypeValidator::QName);
        const XMLCh* prefix = getPrefix(baseTypeName);
        const XMLCh* localPart = getLocalPart(baseTypeName);
        const XMLCh* uriStr = resolvePrefixToURI(grandKid, prefix);

        if (fTargetNSURI != (int) fURIStringPool->addOrFind(uriStr)
            || fStringPool->addOrFind(localPart) != typeNameId) {
            reportSchemaError(grandKid, XMLUni::fgXMLErrDomain, XMLErrs::Redefine_InvalidSimpleTypeBase);
            return false;
        }

        // now we have to do the renaming...
        getRedefineNewTypeName(baseTypeName, redefineNameCounter, fBuffer);
        grandKid->setAttribute(SchemaSymbols::fgATT_BASE, fBuffer.getRawBuffer());
        fRedefineComponents->put((void*) SchemaSymbols::fgELT_SIMPLETYPE,
                                 fullTypeNameId, 0);
    }
    else if (XMLString::equals(redefineChildComponentName,SchemaSymbols::fgELT_COMPLEXTYPE)) {

        if (fComplexTypeRegistry->containsKey(typeNameStr)) {
            return false;
        }

        DOMElement* grandKid = XUtil::getFirstChildElement(redefineChildElem);

        if (grandKid && XMLString::equals(grandKid->getLocalName(), SchemaSymbols::fgELT_ANNOTATION)) {
            grandKid = XUtil::getNextSiblingElement(grandKid);
        }

        if (grandKid == 0) {
            reportSchemaError(redefineChildElem, XMLUni::fgXMLErrDomain, XMLErrs::Redefine_InvalidComplexType);
            return false;
        } else {

            // have to go one more level down; let another pass worry whether complexType is valid.
            DOMElement* greatGrandKid = XUtil::getFirstChildElement(grandKid);

            if (greatGrandKid != 0 &&
                XMLString::equals(greatGrandKid->getLocalName(), SchemaSymbols::fgELT_ANNOTATION)) {
                greatGrandKid = XUtil::getNextSiblingElement(greatGrandKid);
            }

            if (greatGrandKid == 0) {

                reportSchemaError(grandKid, XMLUni::fgXMLErrDomain, XMLErrs::Redefine_InvalidComplexType);
                return false;
            } else {

                const XMLCh* greatGrandKidName = greatGrandKid->getLocalName();

                if (!XMLString::equals(greatGrandKidName, SchemaSymbols::fgELT_RESTRICTION)
                    && !XMLString::equals(greatGrandKidName, SchemaSymbols::fgELT_EXTENSION)) {

                    reportSchemaError(greatGrandKid, XMLUni::fgXMLErrDomain, XMLErrs::Redefine_InvalidComplexType);
                    return false;
                }

                baseTypeName = getElementAttValue(greatGrandKid, SchemaSymbols::fgATT_BASE, DatatypeValidator::QName);
                const XMLCh* prefix = getPrefix(baseTypeName);
                const XMLCh* localPart = getLocalPart(baseTypeName);
                const XMLCh* uriStr = resolvePrefixToURI(greatGrandKid, prefix);

                if (fTargetNSURI != (int) fURIStringPool->addOrFind(uriStr)
                    || fStringPool->addOrFind(localPart) != typeNameId) {
                    reportSchemaError(greatGrandKid, XMLUni::fgXMLErrDomain, XMLErrs::Redefine_InvalidComplexTypeBase);
                    return false;
                }

                // now we have to do the renaming...
                getRedefineNewTypeName(baseTypeName, redefineNameCounter, fBuffer);
                greatGrandKid->setAttribute(SchemaSymbols::fgATT_BASE, fBuffer.getRawBuffer());
                fRedefineComponents->put((void*) SchemaSymbols::fgELT_COMPLEXTYPE,
                                         fullTypeNameId, 0);
            }
        }
    }
    else if (XMLString::equals(redefineChildComponentName, SchemaSymbols::fgELT_GROUP)) {

        if (fGroupRegistry->containsKey(typeNameStr)) {
            return false;
        }

        int groupRefCount = changeRedefineGroup(redefineChildElem, redefineChildComponentName,
                                                redefineChildTypeName, redefineNameCounter);

        if (groupRefCount > 1) {

            reportSchemaError(redefineChildElem, XMLUni::fgXMLErrDomain, XMLErrs::Redefine_GroupRefCount);
            return false;
        }
        else if (groupRefCount == 0) {
            // put a dummy value, default is null.
            // when processing groups, we will check that table, if a value
            // is found, we need to do a particle derivation check.
            fRedefineComponents->put((void*) SchemaSymbols::fgELT_GROUP,
                                     fullTypeNameId, fSchemaInfo->getCurrentSchemaURL());
        }
        else {
            fRedefineComponents->put((void*) SchemaSymbols::fgELT_GROUP, fullTypeNameId, 0);
        }
    }
    else if (XMLString::equals(redefineChildComponentName, SchemaSymbols::fgELT_ATTRIBUTEGROUP)) {

        if (fAttGroupRegistry->containsKey(redefineChildTypeName)) {
            return false;
        }

        int attGroupRefCount = changeRedefineGroup(redefineChildElem, redefineChildComponentName,
                                                   redefineChildTypeName, redefineNameCounter);

        if (attGroupRefCount > 1) {

            reportSchemaError(redefineChildElem, XMLUni::fgXMLErrDomain, XMLErrs::Redefine_AttGroupRefCount);
            return false;
        }
        else if (attGroupRefCount == 0) {
            // put a dummy value, default is null.
            // when processing attributeGroups, we will check that table, if
            // a value is found, we need to check for attribute derivation ok
            // (by restriction)
            fRedefineComponents->put((void*) SchemaSymbols::fgELT_ATTRIBUTEGROUP,
                                     fullTypeNameId, fSchemaInfo->getCurrentSchemaURL());
        }
        else {
            fRedefineComponents->put((void*) SchemaSymbols::fgELT_ATTRIBUTEGROUP, fullTypeNameId, 0);
        }
    }
    else {
        reportSchemaError
        (
            redefineChildElem
            , XMLUni::fgXMLErrDomain
            , XMLErrs::Redefine_InvalidChild
            , redefineChildComponentName
        );
        return false;
    }

    return true;
}